

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O3

void Ssw_ManRollForward(Ssw_Man_t *p,int nFrames)

{
  undefined1 *puVar1;
  void *pvVar2;
  Aig_Man_t *pAVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswFilter.c"
                  ,100,"void Ssw_ManRollForward(Ssw_Man_t *, int)");
  }
  pAVar3 = p->pAig;
  if (0 < pAVar3->nRegs) {
    iVar6 = 0;
    do {
      uVar8 = pAVar3->nTruePos + iVar6;
      if (((int)uVar8 < 0) || (pAVar3->vCos->nSize <= (int)uVar8)) goto LAB_00618c8d;
      iVar4 = pAVar3->nTruePis + iVar6;
      pvVar2 = pAVar3->vCos->pArray[uVar8];
      *(ulong *)((long)pvVar2 + 0x18) =
           *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
           (ulong)((p->pPatWords[iVar4 >> 5] >> ((byte)iVar4 & 0x1f) & 1) << 5);
      iVar6 = iVar6 + 1;
      pAVar3 = p->pAig;
    } while (iVar6 < pAVar3->nRegs);
  }
  iVar6 = 0;
  do {
    puVar1 = &pAVar3->pConst1->field_0x18;
    *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
    pAVar3 = p->pAig;
    if (0 < pAVar3->nTruePis) {
      lVar11 = 0;
      do {
        if (pAVar3->vCis->nSize <= lVar11) goto LAB_00618c8d;
        pvVar2 = pAVar3->vCis->pArray[lVar11];
        uVar8 = Aig_ManRandom(0);
        *(ulong *)((long)pvVar2 + 0x18) =
             *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf | (ulong)((uVar8 & 1) << 5);
        lVar11 = lVar11 + 1;
        pAVar3 = p->pAig;
      } while (lVar11 < pAVar3->nTruePis);
    }
    if (0 < pAVar3->nRegs) {
      iVar4 = 0;
      do {
        uVar8 = pAVar3->nTruePos + iVar4;
        if (((int)uVar8 < 0) || (pAVar3->vCos->nSize <= (int)uVar8)) goto LAB_00618c8d;
        uVar9 = pAVar3->nTruePis + iVar4;
        if (((int)uVar9 < 0) || (pAVar3->vCis->nSize <= (int)uVar9)) goto LAB_00618c8d;
        pvVar2 = pAVar3->vCis->pArray[uVar9];
        *(ulong *)((long)pvVar2 + 0x18) =
             *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
             (ulong)((uint)*(undefined8 *)((long)pAVar3->vCos->pArray[uVar8] + 0x18) & 0x20);
        iVar4 = iVar4 + 1;
        pAVar3 = p->pAig;
      } while (iVar4 < pAVar3->nRegs);
    }
    pVVar7 = pAVar3->vObjs;
    if (0 < pVVar7->nSize) {
      lVar11 = 0;
      do {
        pvVar2 = pVVar7->pArray[lVar11];
        if (pvVar2 != (void *)0x0) {
          if (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7) {
            *(ulong *)((long)pvVar2 + 0x18) =
                 *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
                 (ulong)((((uint)*(ulong *)((long)pvVar2 + 0x10) ^
                          *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18)
                          >> 5) & ((uint)*(ulong *)((long)pvVar2 + 8) ^
                                  *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) +
                                           0x18) >> 5) & 1) << 5);
            pAVar3 = p->pAig;
          }
        }
        lVar11 = lVar11 + 1;
        pVVar7 = pAVar3->vObjs;
      } while (lVar11 < pVVar7->nSize);
    }
    pVVar7 = pAVar3->vCos;
    if (0 < pVVar7->nSize) {
      lVar11 = 0;
      do {
        pvVar2 = pVVar7->pArray[lVar11];
        *(ulong *)((long)pvVar2 + 0x18) =
             *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
             (ulong)(((int)*(ulong *)((long)pvVar2 + 8) << 5 ^
                     *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
        lVar11 = lVar11 + 1;
        pAVar3 = p->pAig;
        pVVar7 = pAVar3->vCos;
      } while (lVar11 < pVVar7->nSize);
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != nFrames);
  iVar6 = pAVar3->nRegs;
  if (0 < iVar6) {
    pVVar7 = pAVar3->vCos;
    iVar4 = 0;
    do {
      uVar8 = pAVar3->nTruePos + iVar4;
      if (((int)uVar8 < 0) || (pVVar7->nSize <= (int)uVar8)) {
LAB_00618c8d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar5 = pAVar3->nTruePis + iVar4;
      iVar10 = (int)uVar5 >> 5;
      uVar9 = p->pPatWords[iVar10];
      uVar5 = uVar5 & 0x1f;
      if (((uVar9 >> (sbyte)uVar5 ^ *(uint *)((long)pVVar7->pArray[uVar8] + 0x18) >> 5) & 1) != 0) {
        p->pPatWords[iVar10] = uVar9 ^ 1 << uVar5;
        iVar6 = pAVar3->nRegs;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < iVar6);
  }
  return;
}

Assistant:

void Ssw_ManRollForward( Ssw_Man_t * p, int nFrames )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i;
    assert( nFrames > 0 );
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
    // simulate the timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = Aig_ManRandom(0) & 1;
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
    }
    // record the new pattern
    Saig_ManForEachLi( p->pAig, pObj, i )
        if ( pObj->fMarkB ^ Abc_InfoHasBit(p->pPatWords, Saig_ManPiNum(p->pAig) + i) )
            Abc_InfoXorBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
}